

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  RayK<1> *pRVar40;
  undefined4 uVar41;
  undefined1 (*pauVar42) [16];
  long lVar43;
  ulong uVar44;
  RTCRayQueryContext *pRVar45;
  uint uVar46;
  ulong uVar47;
  undefined1 (*pauVar48) [16];
  int *piVar49;
  ulong uVar50;
  undefined1 (*pauVar51) [16];
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  undefined1 (*pauVar56) [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar67;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar65;
  float fVar66;
  undefined1 auVar64 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  float fVar98;
  undefined1 auVar99 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar100 [64];
  uint uVar106;
  uint uVar107;
  uint uVar108;
  undefined1 auVar105 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  float fVar112;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar118;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2680;
  undefined8 uStack_2678;
  int local_2664;
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  RayQueryContext *local_2630;
  Scene *local_2628;
  undefined1 local_2620 [16];
  RTCFilterFunctionNArguments local_2610;
  undefined1 local_25e0 [16];
  Geometry *local_25c8;
  int *local_25c0;
  long local_25b8;
  undefined4 local_25b0;
  undefined4 local_25ac;
  undefined4 local_25a8;
  float local_25a4;
  float local_25a0;
  undefined4 local_259c;
  uint local_2598;
  uint local_2594;
  uint local_2590;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 local_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2510 [16];
  float local_2500 [4];
  float local_24f0 [4];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined8 local_24b0;
  undefined8 uStack_24a8;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2630 = context;
    pauVar42 = (undefined1 (*) [16])local_2390;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar68 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar79 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar89._8_4_ = 0x7fffffff;
    auVar89._0_8_ = 0x7fffffff7fffffff;
    auVar89._12_4_ = 0x7fffffff;
    auVar89 = vandps_avx((undefined1  [16])aVar2,auVar89);
    auVar91._8_4_ = 0x219392ef;
    auVar91._0_8_ = 0x219392ef219392ef;
    auVar91._12_4_ = 0x219392ef;
    auVar89 = vcmpps_avx(auVar89,auVar91,1);
    auVar89 = vblendvps_avx((undefined1  [16])aVar2,auVar91,auVar89);
    uStack_2398 = 0;
    auVar91 = vrcpps_avx(auVar89);
    fVar57 = auVar91._0_4_;
    auVar85._0_4_ = auVar89._0_4_ * fVar57;
    fVar65 = auVar91._4_4_;
    auVar85._4_4_ = auVar89._4_4_ * fVar65;
    fVar66 = auVar91._8_4_;
    auVar85._8_4_ = auVar89._8_4_ * fVar66;
    fVar67 = auVar91._12_4_;
    auVar85._12_4_ = auVar89._12_4_ * fVar67;
    auVar92._8_4_ = 0x3f800000;
    auVar92._0_8_ = 0x3f8000003f800000;
    auVar92._12_4_ = 0x3f800000;
    auVar89 = vsubps_avx(auVar92,auVar85);
    uVar41 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar41;
    local_23c0._0_4_ = uVar41;
    local_23c0._8_4_ = uVar41;
    local_23c0._12_4_ = uVar41;
    local_23c0._16_4_ = uVar41;
    local_23c0._20_4_ = uVar41;
    local_23c0._24_4_ = uVar41;
    local_23c0._28_4_ = uVar41;
    auVar94 = ZEXT3264(local_23c0);
    uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar41;
    local_23e0._0_4_ = uVar41;
    local_23e0._8_4_ = uVar41;
    local_23e0._12_4_ = uVar41;
    local_23e0._16_4_ = uVar41;
    local_23e0._20_4_ = uVar41;
    local_23e0._24_4_ = uVar41;
    local_23e0._28_4_ = uVar41;
    auVar97 = ZEXT3264(local_23e0);
    uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar41;
    local_2400._0_4_ = uVar41;
    local_2400._8_4_ = uVar41;
    local_2400._12_4_ = uVar41;
    local_2400._16_4_ = uVar41;
    local_2400._20_4_ = uVar41;
    local_2400._24_4_ = uVar41;
    local_2400._28_4_ = uVar41;
    auVar100 = ZEXT3264(local_2400);
    auVar86._0_4_ = fVar57 + fVar57 * auVar89._0_4_;
    auVar86._4_4_ = fVar65 + fVar65 * auVar89._4_4_;
    auVar86._8_4_ = fVar66 + fVar66 * auVar89._8_4_;
    auVar86._12_4_ = fVar67 + fVar67 * auVar89._12_4_;
    auVar89 = vshufps_avx(auVar86,auVar86,0);
    local_2420._16_16_ = auVar89;
    local_2420._0_16_ = auVar89;
    auVar105 = ZEXT3264(local_2420);
    auVar89 = vmovshdup_avx(auVar86);
    auVar91 = vshufps_avx(auVar86,auVar86,0x55);
    local_2440._16_16_ = auVar91;
    local_2440._0_16_ = auVar91;
    auVar109 = ZEXT3264(local_2440);
    auVar91 = vshufpd_avx(auVar86,auVar86,1);
    auVar85 = vshufps_avx(auVar86,auVar86,0xaa);
    uVar54 = (ulong)(auVar86._0_4_ < 0.0) * 0x20;
    local_2460._16_16_ = auVar85;
    local_2460._0_16_ = auVar85;
    auVar110 = ZEXT3264(local_2460);
    uVar55 = (ulong)(auVar89._0_4_ < 0.0) << 5 | 0x40;
    uVar52 = (ulong)(auVar91._0_4_ < 0.0) << 5 | 0x80;
    auVar89 = vshufps_avx(auVar68,auVar68,0);
    local_2480._16_16_ = auVar89;
    local_2480._0_16_ = auVar89;
    auVar111 = ZEXT3264(local_2480);
    auVar89 = vshufps_avx(auVar79,auVar79,0);
    auVar64 = ZEXT3264(CONCAT1616(auVar89,auVar89));
    local_2580 = mm_lookupmask_ps._240_8_;
    uStack_2578 = mm_lookupmask_ps._248_8_;
LAB_014c8536:
    do {
      pauVar56 = pauVar42 + -1;
      pauVar42 = pauVar42 + -1;
      if (*(float *)(*pauVar56 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar50 = *(ulong *)*pauVar42;
        while ((uVar50 & 8) == 0) {
          auVar93 = auVar94._0_32_;
          auVar32 = vsubps_avx(*(undefined1 (*) [32])(uVar50 + 0x40 + uVar54),auVar93);
          auVar33._4_4_ = auVar105._4_4_ * auVar32._4_4_;
          auVar33._0_4_ = auVar105._0_4_ * auVar32._0_4_;
          auVar33._8_4_ = auVar105._8_4_ * auVar32._8_4_;
          auVar33._12_4_ = auVar105._12_4_ * auVar32._12_4_;
          auVar33._16_4_ = auVar105._16_4_ * auVar32._16_4_;
          auVar33._20_4_ = auVar105._20_4_ * auVar32._20_4_;
          auVar33._24_4_ = auVar105._24_4_ * auVar32._24_4_;
          auVar33._28_4_ = auVar32._28_4_;
          auVar96 = auVar97._0_32_;
          auVar32 = vsubps_avx(*(undefined1 (*) [32])(uVar50 + 0x40 + uVar55),auVar96);
          auVar99._4_4_ = auVar109._4_4_ * auVar32._4_4_;
          auVar99._0_4_ = auVar109._0_4_ * auVar32._0_4_;
          auVar99._8_4_ = auVar109._8_4_ * auVar32._8_4_;
          auVar99._12_4_ = auVar109._12_4_ * auVar32._12_4_;
          auVar99._16_4_ = auVar109._16_4_ * auVar32._16_4_;
          auVar99._20_4_ = auVar109._20_4_ * auVar32._20_4_;
          auVar99._24_4_ = auVar109._24_4_ * auVar32._24_4_;
          auVar99._28_4_ = auVar32._28_4_;
          auVar32 = vmaxps_avx(auVar33,auVar99);
          auVar99 = auVar100._0_32_;
          auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar50 + 0x40 + uVar52),auVar99);
          auVar35._4_4_ = auVar110._4_4_ * auVar33._4_4_;
          auVar35._0_4_ = auVar110._0_4_ * auVar33._0_4_;
          auVar35._8_4_ = auVar110._8_4_ * auVar33._8_4_;
          auVar35._12_4_ = auVar110._12_4_ * auVar33._12_4_;
          auVar35._16_4_ = auVar110._16_4_ * auVar33._16_4_;
          auVar35._20_4_ = auVar110._20_4_ * auVar33._20_4_;
          auVar35._24_4_ = auVar110._24_4_ * auVar33._24_4_;
          auVar35._28_4_ = auVar33._28_4_;
          auVar33 = vmaxps_avx(auVar35,auVar111._0_32_);
          local_2560 = vmaxps_avx(auVar32,auVar33);
          auVar32 = vsubps_avx(*(undefined1 (*) [32])(uVar50 + 0x40 + (uVar54 ^ 0x20)),auVar93);
          auVar36._4_4_ = auVar105._4_4_ * auVar32._4_4_;
          auVar36._0_4_ = auVar105._0_4_ * auVar32._0_4_;
          auVar36._8_4_ = auVar105._8_4_ * auVar32._8_4_;
          auVar36._12_4_ = auVar105._12_4_ * auVar32._12_4_;
          auVar36._16_4_ = auVar105._16_4_ * auVar32._16_4_;
          auVar36._20_4_ = auVar105._20_4_ * auVar32._20_4_;
          auVar36._24_4_ = auVar105._24_4_ * auVar32._24_4_;
          auVar36._28_4_ = auVar32._28_4_;
          auVar32 = vsubps_avx(*(undefined1 (*) [32])(uVar50 + 0x40 + (uVar55 ^ 0x20)),auVar96);
          auVar37._4_4_ = auVar109._4_4_ * auVar32._4_4_;
          auVar37._0_4_ = auVar109._0_4_ * auVar32._0_4_;
          auVar37._8_4_ = auVar109._8_4_ * auVar32._8_4_;
          auVar37._12_4_ = auVar109._12_4_ * auVar32._12_4_;
          auVar37._16_4_ = auVar109._16_4_ * auVar32._16_4_;
          auVar37._20_4_ = auVar109._20_4_ * auVar32._20_4_;
          auVar37._24_4_ = auVar109._24_4_ * auVar32._24_4_;
          auVar37._28_4_ = auVar32._28_4_;
          auVar32 = vminps_avx(auVar36,auVar37);
          auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar50 + 0x40 + (uVar52 ^ 0x20)),auVar99);
          auVar38._4_4_ = auVar110._4_4_ * auVar33._4_4_;
          auVar38._0_4_ = auVar110._0_4_ * auVar33._0_4_;
          auVar38._8_4_ = auVar110._8_4_ * auVar33._8_4_;
          auVar38._12_4_ = auVar110._12_4_ * auVar33._12_4_;
          auVar38._16_4_ = auVar110._16_4_ * auVar33._16_4_;
          auVar38._20_4_ = auVar110._20_4_ * auVar33._20_4_;
          auVar38._24_4_ = auVar110._24_4_ * auVar33._24_4_;
          auVar38._28_4_ = auVar33._28_4_;
          auVar33 = vminps_avx(auVar38,auVar64._0_32_);
          auVar32 = vminps_avx(auVar32,auVar33);
          auVar32 = vcmpps_avx(local_2560,auVar32,2);
          uVar46 = vmovmskps_avx(auVar32);
          if (uVar46 == 0) {
            if (pauVar42 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014c8536;
          }
          uVar46 = uVar46 & 0xff;
          uVar44 = uVar50 & 0xfffffffffffffff0;
          lVar53 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
            }
          }
          uVar50 = *(ulong *)(uVar44 + lVar53 * 8);
          uVar46 = uVar46 - 1 & uVar46;
          if (uVar46 != 0) {
            uVar106 = *(uint *)(local_2560 + lVar53 * 4);
            lVar53 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
              }
            }
            uVar47 = *(ulong *)(uVar44 + lVar53 * 8);
            uVar107 = *(uint *)(local_2560 + lVar53 * 4);
            uVar46 = uVar46 - 1 & uVar46;
            if (uVar46 == 0) {
              if (uVar106 < uVar107) {
                *(ulong *)*pauVar42 = uVar47;
                *(uint *)(*pauVar42 + 8) = uVar107;
                pauVar42 = pauVar42 + 1;
              }
              else {
                *(ulong *)*pauVar42 = uVar50;
                *(uint *)(*pauVar42 + 8) = uVar106;
                pauVar42 = pauVar42 + 1;
                uVar50 = uVar47;
              }
            }
            else {
              auVar68._8_8_ = 0;
              auVar68._0_8_ = uVar50;
              auVar89 = vpunpcklqdq_avx(auVar68,ZEXT416(uVar106));
              auVar79._8_8_ = 0;
              auVar79._0_8_ = uVar47;
              auVar68 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar107));
              lVar53 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                }
              }
              auVar87._8_8_ = 0;
              auVar87._0_8_ = *(ulong *)(uVar44 + lVar53 * 8);
              auVar79 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_2560 + lVar53 * 4)));
              uVar46 = uVar46 - 1 & uVar46;
              if (uVar46 == 0) {
                auVar91 = vpcmpgtd_avx(auVar68,auVar89);
                auVar85 = vpshufd_avx(auVar91,0xaa);
                auVar91 = vblendvps_avx(auVar68,auVar89,auVar85);
                auVar89 = vblendvps_avx(auVar89,auVar68,auVar85);
                auVar68 = vpcmpgtd_avx(auVar79,auVar91);
                auVar85 = vpshufd_avx(auVar68,0xaa);
                auVar68 = vblendvps_avx(auVar79,auVar91,auVar85);
                auVar79 = vblendvps_avx(auVar91,auVar79,auVar85);
                auVar91 = vpcmpgtd_avx(auVar79,auVar89);
                auVar85 = vpshufd_avx(auVar91,0xaa);
                auVar91 = vblendvps_avx(auVar79,auVar89,auVar85);
                auVar89 = vblendvps_avx(auVar89,auVar79,auVar85);
                *pauVar42 = auVar89;
                pauVar42[1] = auVar91;
                uVar50 = auVar68._0_8_;
                pauVar42 = pauVar42 + 2;
              }
              else {
                lVar53 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                  }
                }
                auVar90._8_8_ = 0;
                auVar90._0_8_ = *(ulong *)(uVar44 + lVar53 * 8);
                auVar91 = vpunpcklqdq_avx(auVar90,ZEXT416(*(uint *)(local_2560 + lVar53 * 4)));
                uVar46 = uVar46 - 1 & uVar46;
                uVar47 = (ulong)uVar46;
                if (uVar46 == 0) {
                  auVar85 = vpcmpgtd_avx(auVar68,auVar89);
                  auVar86 = vpshufd_avx(auVar85,0xaa);
                  auVar85 = vblendvps_avx(auVar68,auVar89,auVar86);
                  auVar89 = vblendvps_avx(auVar89,auVar68,auVar86);
                  auVar68 = vpcmpgtd_avx(auVar91,auVar79);
                  auVar86 = vpshufd_avx(auVar68,0xaa);
                  auVar68 = vblendvps_avx(auVar91,auVar79,auVar86);
                  auVar79 = vblendvps_avx(auVar79,auVar91,auVar86);
                  auVar91 = vpcmpgtd_avx(auVar79,auVar89);
                  auVar86 = vpshufd_avx(auVar91,0xaa);
                  auVar91 = vblendvps_avx(auVar79,auVar89,auVar86);
                  auVar89 = vblendvps_avx(auVar89,auVar79,auVar86);
                  auVar79 = vpcmpgtd_avx(auVar68,auVar85);
                  auVar86 = vpshufd_avx(auVar79,0xaa);
                  auVar79 = vblendvps_avx(auVar68,auVar85,auVar86);
                  auVar68 = vblendvps_avx(auVar85,auVar68,auVar86);
                  auVar85 = vpcmpgtd_avx(auVar91,auVar68);
                  auVar86 = vpshufd_avx(auVar85,0xaa);
                  auVar85 = vblendvps_avx(auVar91,auVar68,auVar86);
                  auVar68 = vblendvps_avx(auVar68,auVar91,auVar86);
                  *pauVar42 = auVar89;
                  pauVar42[1] = auVar68;
                  pauVar42[2] = auVar85;
                  uVar50 = auVar79._0_8_;
                  pauVar56 = pauVar42 + 3;
                }
                else {
                  *pauVar42 = auVar89;
                  pauVar42[1] = auVar68;
                  pauVar42[2] = auVar79;
                  pauVar42[3] = auVar91;
                  lVar53 = 0x30;
                  do {
                    lVar43 = lVar53;
                    lVar53 = 0;
                    if (uVar47 != 0) {
                      for (; (uVar47 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                      }
                    }
                    uVar50 = *(ulong *)(uVar44 + lVar53 * 8);
                    auVar69._8_8_ = 0;
                    auVar69._0_8_ = uVar50;
                    auVar89 = vpunpcklqdq_avx(auVar69,ZEXT416(*(uint *)(local_2560 + lVar53 * 4)));
                    *(undefined1 (*) [16])(pauVar42[1] + lVar43) = auVar89;
                    uVar47 = uVar47 & uVar47 - 1;
                    lVar53 = lVar43 + 0x10;
                  } while (uVar47 != 0);
                  pauVar56 = (undefined1 (*) [16])(pauVar42[1] + lVar43);
                  if (lVar43 + 0x10 != 0) {
                    lVar53 = 0x10;
                    pauVar48 = pauVar42;
                    do {
                      auVar89 = pauVar48[1];
                      pauVar48 = pauVar48 + 1;
                      uVar46 = vextractps_avx(auVar89,2);
                      lVar43 = lVar53;
                      do {
                        if (uVar46 <= *(uint *)(pauVar42[-1] + lVar43 + 8)) {
                          pauVar51 = (undefined1 (*) [16])(*pauVar42 + lVar43);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar42 + lVar43) =
                             *(undefined1 (*) [16])(pauVar42[-1] + lVar43);
                        lVar43 = lVar43 + -0x10;
                        pauVar51 = pauVar42;
                      } while (lVar43 != 0);
                      *pauVar51 = auVar89;
                      lVar53 = lVar53 + 0x10;
                    } while (pauVar56 != pauVar48);
                    uVar50 = *(ulong *)*pauVar56;
                  }
                }
                auVar94 = ZEXT3264(auVar93);
                auVar97 = ZEXT3264(auVar96);
                auVar100 = ZEXT3264(auVar99);
                auVar105 = ZEXT3264(auVar105._0_32_);
                auVar109 = ZEXT3264(auVar109._0_32_);
                auVar110 = ZEXT3264(auVar110._0_32_);
                auVar111 = ZEXT3264(auVar111._0_32_);
                pauVar42 = pauVar56;
              }
            }
          }
        }
        local_25b8 = (ulong)((uint)uVar50 & 0xf) - 8;
        if (local_25b8 != 0) {
          uVar50 = uVar50 & 0xfffffffffffffff0;
          local_2628 = local_2630->scene;
          lVar53 = 0;
          do {
            lVar43 = lVar53 * 0x50;
            ppfVar3 = (local_2628->vertices).items;
            pfVar4 = ppfVar3[*(uint *)(uVar50 + 0x30 + lVar43)];
            pfVar5 = ppfVar3[*(uint *)(uVar50 + 0x34 + lVar43)];
            pfVar6 = ppfVar3[*(uint *)(uVar50 + 0x38 + lVar43)];
            pfVar7 = ppfVar3[*(uint *)(uVar50 + 0x3c + lVar43)];
            auVar79 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar50 + lVar43)),
                                    *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar50 + 8 + lVar43)))
            ;
            auVar89 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar50 + lVar43)),
                                    *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar50 + 8 + lVar43)))
            ;
            auVar91 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar50 + 4 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar50 + 0xc + lVar43)));
            auVar68 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar50 + 4 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar50 + 0xc + lVar43)));
            auVar92 = vunpcklps_avx(auVar89,auVar68);
            auVar87 = vunpcklps_avx(auVar79,auVar91);
            auVar86 = vunpckhps_avx(auVar79,auVar91);
            auVar79 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar50 + 0x10 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar50 + 0x18 + lVar43)));
            auVar89 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar50 + 0x10 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar50 + 0x18 + lVar43)));
            auVar91 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar50 + 0x14 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar50 + 0x1c + lVar43)));
            auVar68 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar50 + 0x14 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar50 + 0x1c + lVar43)));
            auVar85 = vunpcklps_avx(auVar89,auVar68);
            auVar90 = vunpcklps_avx(auVar79,auVar91);
            auVar89 = vunpckhps_avx(auVar79,auVar91);
            auVar91 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar50 + 0x20 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar50 + 0x28 + lVar43)));
            auVar68 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar50 + 0x20 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar50 + 0x28 + lVar43)));
            auVar69 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar50 + 0x24 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar50 + 0x2c + lVar43)));
            auVar79 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar50 + 0x24 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar50 + 0x2c + lVar43)));
            auVar34 = vunpcklps_avx(auVar68,auVar79);
            auVar68 = vunpcklps_avx(auVar91,auVar69);
            auVar91 = vunpckhps_avx(auVar91,auVar69);
            puVar1 = (undefined8 *)(uVar50 + 0x30 + lVar43);
            local_2490 = *puVar1;
            uStack_2488 = puVar1[1];
            puVar1 = (undefined8 *)(uVar50 + 0x40 + lVar43);
            local_2570 = *puVar1;
            uStack_2568 = puVar1[1];
            auVar79 = vsubps_avx(auVar87,auVar90);
            local_25e0 = auVar79;
            local_2650 = vsubps_avx(auVar86,auVar89);
            auVar89 = vsubps_avx(auVar92,auVar85);
            auVar68 = vsubps_avx(auVar68,auVar87);
            auVar91 = vsubps_avx(auVar91,auVar86);
            auVar85 = vsubps_avx(auVar34,auVar92);
            fVar67 = auVar85._0_4_;
            fVar118 = local_2650._0_4_;
            auVar58._0_4_ = fVar118 * fVar67;
            fVar14 = auVar85._4_4_;
            fVar121 = local_2650._4_4_;
            auVar58._4_4_ = fVar121 * fVar14;
            fVar20 = auVar85._8_4_;
            fVar122 = local_2650._8_4_;
            auVar58._8_4_ = fVar122 * fVar20;
            fVar26 = auVar85._12_4_;
            fVar123 = local_2650._12_4_;
            auVar58._12_4_ = fVar123 * fVar26;
            fVar104 = auVar91._0_4_;
            fVar98 = auVar89._0_4_;
            auVar70._0_4_ = fVar98 * fVar104;
            fVar15 = auVar91._4_4_;
            fVar101 = auVar89._4_4_;
            auVar70._4_4_ = fVar101 * fVar15;
            fVar21 = auVar91._8_4_;
            fVar102 = auVar89._8_4_;
            auVar70._8_4_ = fVar102 * fVar21;
            fVar27 = auVar91._12_4_;
            fVar103 = auVar89._12_4_;
            auVar70._12_4_ = fVar103 * fVar27;
            local_24d0 = vsubps_avx(auVar70,auVar58);
            fVar10 = auVar68._0_4_;
            auVar71._0_4_ = fVar98 * fVar10;
            fVar16 = auVar68._4_4_;
            auVar71._4_4_ = fVar101 * fVar16;
            fVar22 = auVar68._8_4_;
            auVar71._8_4_ = fVar102 * fVar22;
            fVar28 = auVar68._12_4_;
            auVar71._12_4_ = fVar103 * fVar28;
            fVar112 = auVar79._0_4_;
            auVar80._0_4_ = fVar112 * fVar67;
            fVar115 = auVar79._4_4_;
            auVar80._4_4_ = fVar115 * fVar14;
            fVar116 = auVar79._8_4_;
            auVar80._8_4_ = fVar116 * fVar20;
            fVar117 = auVar79._12_4_;
            auVar80._12_4_ = fVar117 * fVar26;
            local_24c0 = vsubps_avx(auVar80,auVar71);
            auVar81._0_4_ = fVar112 * fVar104;
            auVar81._4_4_ = fVar115 * fVar15;
            auVar81._8_4_ = fVar116 * fVar21;
            auVar81._12_4_ = fVar117 * fVar27;
            auVar88._0_4_ = fVar118 * fVar10;
            auVar88._4_4_ = fVar121 * fVar16;
            auVar88._8_4_ = fVar122 * fVar22;
            auVar88._12_4_ = fVar123 * fVar28;
            auVar91 = vsubps_avx(auVar88,auVar81);
            uVar41 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar59._4_4_ = uVar41;
            auVar59._0_4_ = uVar41;
            auVar59._8_4_ = uVar41;
            auVar59._12_4_ = uVar41;
            uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar113._4_4_ = uVar41;
            auVar113._0_4_ = uVar41;
            auVar113._8_4_ = uVar41;
            auVar113._12_4_ = uVar41;
            uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar119._4_4_ = uVar41;
            auVar119._0_4_ = uVar41;
            auVar119._8_4_ = uVar41;
            auVar119._12_4_ = uVar41;
            fVar57 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_2660 = vsubps_avx(auVar87,auVar59);
            fVar65 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar89 = vsubps_avx(auVar86,auVar113);
            auVar68 = vsubps_avx(auVar92,auVar119);
            fVar11 = auVar68._0_4_;
            auVar114._0_4_ = fVar57 * fVar11;
            fVar17 = auVar68._4_4_;
            auVar114._4_4_ = fVar57 * fVar17;
            fVar23 = auVar68._8_4_;
            auVar114._8_4_ = fVar57 * fVar23;
            fVar29 = auVar68._12_4_;
            auVar114._12_4_ = fVar57 * fVar29;
            fVar12 = auVar89._0_4_;
            auVar120._0_4_ = fVar65 * fVar12;
            fVar18 = auVar89._4_4_;
            auVar120._4_4_ = fVar65 * fVar18;
            fVar24 = auVar89._8_4_;
            auVar120._8_4_ = fVar65 * fVar24;
            fVar30 = auVar89._12_4_;
            auVar120._12_4_ = fVar65 * fVar30;
            auVar68 = vsubps_avx(auVar120,auVar114);
            fVar66 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar13 = local_2660._0_4_;
            auVar60._0_4_ = fVar65 * fVar13;
            fVar19 = local_2660._4_4_;
            auVar60._4_4_ = fVar65 * fVar19;
            fVar25 = local_2660._8_4_;
            auVar60._8_4_ = fVar65 * fVar25;
            fVar31 = local_2660._12_4_;
            auVar60._12_4_ = fVar65 * fVar31;
            auVar72._0_4_ = fVar66 * fVar11;
            auVar72._4_4_ = fVar66 * fVar17;
            auVar72._8_4_ = fVar66 * fVar23;
            auVar72._12_4_ = fVar66 * fVar29;
            auVar85 = vsubps_avx(auVar72,auVar60);
            auVar73._0_4_ = fVar66 * fVar12;
            auVar73._4_4_ = fVar66 * fVar18;
            auVar73._8_4_ = fVar66 * fVar24;
            auVar73._12_4_ = fVar66 * fVar30;
            auVar82._0_4_ = fVar57 * fVar13;
            auVar82._4_4_ = fVar57 * fVar19;
            auVar82._8_4_ = fVar57 * fVar25;
            auVar82._12_4_ = fVar57 * fVar31;
            auVar86 = vsubps_avx(auVar82,auVar73);
            auVar83._0_4_ =
                 fVar66 * local_24d0._0_4_ + fVar57 * local_24c0._0_4_ + fVar65 * auVar91._0_4_;
            auVar83._4_4_ =
                 fVar66 * local_24d0._4_4_ + fVar57 * local_24c0._4_4_ + fVar65 * auVar91._4_4_;
            auVar83._8_4_ =
                 fVar66 * local_24d0._8_4_ + fVar57 * local_24c0._8_4_ + fVar65 * auVar91._8_4_;
            auVar83._12_4_ =
                 fVar66 * local_24d0._12_4_ + fVar57 * local_24c0._12_4_ + fVar65 * auVar91._12_4_;
            auVar74._8_8_ = 0x8000000080000000;
            auVar74._0_8_ = 0x8000000080000000;
            auVar89 = vandps_avx(auVar83,auVar74);
            uVar46 = auVar89._0_4_;
            local_2560._0_4_ =
                 (float)(uVar46 ^ (uint)(fVar10 * auVar68._0_4_ +
                                        fVar104 * auVar85._0_4_ + fVar67 * auVar86._0_4_));
            uVar106 = auVar89._4_4_;
            local_2560._4_4_ =
                 (float)(uVar106 ^
                        (uint)(fVar16 * auVar68._4_4_ +
                              fVar15 * auVar85._4_4_ + fVar14 * auVar86._4_4_));
            uVar107 = auVar89._8_4_;
            local_2560._8_4_ =
                 (float)(uVar107 ^
                        (uint)(fVar22 * auVar68._8_4_ +
                              fVar21 * auVar85._8_4_ + fVar20 * auVar86._8_4_));
            uVar108 = auVar89._12_4_;
            local_2560._12_4_ =
                 (float)(uVar108 ^
                        (uint)(fVar28 * auVar68._12_4_ +
                              fVar27 * auVar85._12_4_ + fVar26 * auVar86._12_4_));
            local_2560._16_4_ =
                 (float)(uVar46 ^ (uint)(auVar68._0_4_ * fVar112 +
                                        auVar85._0_4_ * fVar118 + fVar98 * auVar86._0_4_));
            local_2560._20_4_ =
                 (float)(uVar106 ^
                        (uint)(auVar68._4_4_ * fVar115 +
                              auVar85._4_4_ * fVar121 + fVar101 * auVar86._4_4_));
            local_2560._24_4_ =
                 (float)(uVar107 ^
                        (uint)(auVar68._8_4_ * fVar116 +
                              auVar85._8_4_ * fVar122 + fVar102 * auVar86._8_4_));
            local_2560._28_4_ =
                 (float)(uVar108 ^
                        (uint)(auVar68._12_4_ * fVar117 +
                              auVar85._12_4_ * fVar123 + fVar103 * auVar86._12_4_));
            auVar85 = ZEXT416(0) << 0x20;
            auVar89 = vcmpps_avx(local_2560._0_16_,auVar85,5);
            auVar68 = vcmpps_avx(local_2560._16_16_,auVar85,5);
            auVar89 = vandps_avx(auVar89,auVar68);
            auVar75._8_4_ = 0x7fffffff;
            auVar75._0_8_ = 0x7fffffff7fffffff;
            auVar75._12_4_ = 0x7fffffff;
            local_2530 = vandps_avx(auVar83,auVar75);
            auVar68 = vcmpps_avx(auVar85,auVar83,4);
            auVar89 = vandps_avx(auVar89,auVar68);
            auVar76._0_4_ = local_2560._0_4_ + local_2560._16_4_;
            auVar76._4_4_ = local_2560._4_4_ + local_2560._20_4_;
            auVar76._8_4_ = local_2560._8_4_ + local_2560._24_4_;
            auVar76._12_4_ = local_2560._12_4_ + local_2560._28_4_;
            auVar68 = vcmpps_avx(auVar76,local_2530,2);
            auVar89 = vandps_avx(auVar89,auVar68);
            auVar34._8_8_ = uStack_2578;
            auVar34._0_8_ = local_2580;
            auVar34 = auVar34 & auVar89;
            local_25e0._0_8_ = lVar53;
            if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar34[0xf] < '\0') {
              auVar39._8_8_ = uStack_2578;
              auVar39._0_8_ = local_2580;
              auVar89 = vandps_avx(auVar89,auVar39);
              local_2540._0_4_ =
                   (float)(uVar46 ^ (uint)(local_24d0._0_4_ * fVar13 +
                                          local_24c0._0_4_ * fVar12 + fVar11 * auVar91._0_4_));
              local_2540._4_4_ =
                   (float)(uVar106 ^
                          (uint)(local_24d0._4_4_ * fVar19 +
                                local_24c0._4_4_ * fVar18 + fVar17 * auVar91._4_4_));
              local_2540._8_4_ =
                   (float)(uVar107 ^
                          (uint)(local_24d0._8_4_ * fVar25 +
                                local_24c0._8_4_ * fVar24 + fVar23 * auVar91._8_4_));
              local_2540._12_4_ =
                   (float)(uVar108 ^
                          (uint)(local_24d0._12_4_ * fVar31 +
                                local_24c0._12_4_ * fVar30 + fVar29 * auVar91._12_4_));
              fVar57 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar65 = local_2530._0_4_;
              auVar61._0_4_ = fVar65 * fVar57;
              fVar66 = local_2530._4_4_;
              auVar61._4_4_ = fVar66 * fVar57;
              fVar67 = local_2530._8_4_;
              auVar61._8_4_ = fVar67 * fVar57;
              fVar104 = local_2530._12_4_;
              auVar61._12_4_ = fVar104 * fVar57;
              auVar68 = vcmpps_avx(auVar61,local_2540,1);
              fVar57 = (ray->super_RayK<1>).tfar;
              auVar77._0_4_ = fVar65 * fVar57;
              auVar77._4_4_ = fVar66 * fVar57;
              auVar77._8_4_ = fVar67 * fVar57;
              auVar77._12_4_ = fVar104 * fVar57;
              auVar85 = vcmpps_avx(local_2540,auVar77,2);
              auVar68 = vandps_avx(auVar85,auVar68);
              auVar85 = auVar89 & auVar68;
              if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar85[0xf] < '\0') {
                local_25e0._8_8_ = auVar79._8_8_;
                auVar95._0_4_ = (ray->super_RayK<1>).tfar;
                auVar95._4_4_ = (ray->super_RayK<1>).mask;
                auVar95._8_4_ = (ray->super_RayK<1>).id;
                auVar95._12_4_ = (ray->super_RayK<1>).flags;
                auVar89 = vandps_avx(auVar89,auVar68);
                local_2510 = auVar89;
                local_2680 = auVar91._0_8_;
                uStack_2678 = auVar91._8_8_;
                local_24b0 = local_2680;
                uStack_24a8 = uStack_2678;
                local_2640 = auVar89;
                auVar68 = vrcpps_avx(local_2530);
                fVar57 = auVar68._0_4_;
                auVar78._0_4_ = fVar65 * fVar57;
                fVar65 = auVar68._4_4_;
                auVar78._4_4_ = fVar66 * fVar65;
                fVar66 = auVar68._8_4_;
                auVar78._8_4_ = fVar67 * fVar66;
                fVar67 = auVar68._12_4_;
                auVar78._12_4_ = fVar104 * fVar67;
                auVar84._8_4_ = 0x3f800000;
                auVar84._0_8_ = 0x3f8000003f800000;
                auVar84._12_4_ = 0x3f800000;
                auVar68 = vsubps_avx(auVar84,auVar78);
                fVar57 = fVar57 + fVar57 * auVar68._0_4_;
                fVar65 = fVar65 + fVar65 * auVar68._4_4_;
                fVar66 = fVar66 + fVar66 * auVar68._8_4_;
                fVar67 = fVar67 + fVar67 * auVar68._12_4_;
                local_2660._0_4_ = fVar57 * local_2540._0_4_;
                local_2660._4_4_ = fVar65 * local_2540._4_4_;
                local_2660._8_4_ = fVar66 * local_2540._8_4_;
                local_2660._12_4_ = fVar67 * local_2540._12_4_;
                local_24e0 = local_2660;
                local_2500[0] = fVar57 * local_2560._0_4_;
                local_2500[1] = fVar65 * local_2560._4_4_;
                local_2500[2] = fVar66 * local_2560._8_4_;
                local_2500[3] = fVar67 * local_2560._12_4_;
                local_24f0[0] = fVar57 * local_2560._16_4_;
                local_24f0[1] = fVar65 * local_2560._20_4_;
                local_24f0[2] = fVar66 * local_2560._24_4_;
                local_24f0[3] = fVar67 * local_2560._28_4_;
                auVar62._8_4_ = 0x7f800000;
                auVar62._0_8_ = 0x7f8000007f800000;
                auVar62._12_4_ = 0x7f800000;
                auVar68 = vblendvps_avx(auVar62,local_2660,auVar89);
                auVar79 = vshufps_avx(auVar68,auVar68,0xb1);
                auVar79 = vminps_avx(auVar79,auVar68);
                auVar91 = vshufpd_avx(auVar79,auVar79,1);
                auVar79 = vminps_avx(auVar91,auVar79);
                auVar68 = vcmpps_avx(auVar68,auVar79,0);
                auVar79 = auVar89 & auVar68;
                if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar79[0xf] < '\0') {
                  auVar89 = vandps_avx(auVar68,auVar89);
                }
                uVar46 = vextractps_avx(auVar95,1);
                uVar41 = vmovmskps_avx(auVar89);
                uVar44 = CONCAT44((int)((ulong)lVar43 >> 0x20),uVar41);
                piVar49 = (int *)0x0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> (long)piVar49 & 1) == 0; piVar49 = (int *)((long)piVar49 + 1)) {
                  }
                }
                do {
                  uVar106 = *(uint *)((long)&local_2490 + (long)piVar49 * 4);
                  pGVar8 = (local_2628->geometries).items[uVar106].ptr;
                  if ((pGVar8->mask & uVar46) == 0) {
                    *(undefined4 *)(local_2640 + (long)piVar49 * 4) = 0;
                  }
                  else {
                    pRVar9 = local_2630->args;
                    if (pRVar9->filter == (RTCFilterFunctionN)0x0) {
                      pRVar45 = local_2630->user;
                      if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar57 = local_2500[(long)piVar49];
                        fVar65 = local_24f0[(long)piVar49];
                        (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + (long)piVar49 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_24d0 + (long)piVar49 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_24c0 + (long)piVar49 * 4);
                        (ray->Ng).field_0.field_0.z =
                             *(float *)((long)&local_24b0 + (long)piVar49 * 4);
                        ray->u = fVar57;
                        ray->v = fVar65;
                        ray->primID = *(uint *)((long)&local_2570 + (long)piVar49 * 4);
                        ray->geomID = uVar106;
                        ray->instID[0] = pRVar45->instID[0];
                        ray->instPrimID[0] = pRVar45->instPrimID[0];
                        break;
                      }
                      local_2620 = auVar95;
                    }
                    else {
                      local_2620 = auVar95;
                      pRVar45 = local_2630->user;
                    }
                    local_25b0 = *(undefined4 *)(local_24d0 + (long)piVar49 * 4);
                    local_25ac = *(undefined4 *)(local_24c0 + (long)piVar49 * 4);
                    local_25a8 = *(undefined4 *)((long)&local_24b0 + (long)piVar49 * 4);
                    local_25a4 = local_2500[(long)piVar49];
                    local_25a0 = local_24f0[(long)piVar49];
                    local_259c = *(undefined4 *)((long)&local_2570 + (long)piVar49 * 4);
                    local_2598 = uVar106;
                    local_2594 = pRVar45->instID[0];
                    local_2590 = pRVar45->instPrimID[0];
                    local_25c0 = piVar49;
                    (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + (long)piVar49 * 4);
                    local_2664 = -1;
                    local_2610.valid = &local_2664;
                    local_2610.geometryUserPtr = pGVar8->userPtr;
                    local_2610.context = pRVar45;
                    local_2650._0_8_ = ray;
                    local_2610.ray = (RTCRayN *)ray;
                    local_2610.hit = (RTCHitN *)&local_25b0;
                    local_2610.N = 1;
                    local_25c8 = pGVar8;
                    local_2620 = auVar95;
                    if (((pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar8->intersectionFilterN)(&local_2610), *local_2610.valid != 0)) &&
                       ((pRVar9->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_25c8->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*pRVar9->filter)(&local_2610), *local_2610.valid != 0)))))) {
                      (((Vec3f *)((long)local_2610.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2610.hit;
                      (((Vec3f *)((long)local_2610.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2610.hit + 4);
                      (((Vec3f *)((long)local_2610.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2610.hit + 8);
                      *(float *)((long)local_2610.ray + 0x3c) = *(float *)(local_2610.hit + 0xc);
                      *(float *)((long)local_2610.ray + 0x40) = *(float *)(local_2610.hit + 0x10);
                      *(float *)((long)local_2610.ray + 0x44) = *(float *)(local_2610.hit + 0x14);
                      *(float *)((long)local_2610.ray + 0x48) = *(float *)(local_2610.hit + 0x18);
                      *(float *)((long)local_2610.ray + 0x4c) = *(float *)(local_2610.hit + 0x1c);
                      *(float *)((long)local_2610.ray + 0x50) = *(float *)(local_2610.hit + 0x20);
                    }
                    else {
                      *(undefined4 *)(local_2650._0_8_ + 0x20) = local_2620._0_4_;
                    }
                    *(undefined4 *)(local_2640 + (long)local_25c0 * 4) = 0;
                    fVar57 = ((RayK<1> *)local_2650._0_8_)->tfar;
                    auVar63._4_4_ = fVar57;
                    auVar63._0_4_ = fVar57;
                    auVar63._8_4_ = fVar57;
                    auVar63._12_4_ = fVar57;
                    auVar89 = vcmpps_avx(local_2660,auVar63,2);
                    local_2640 = vandps_avx(auVar89,local_2640);
                    pRVar40 = (RayK<1> *)local_2650._0_8_;
                    auVar95._0_4_ = pRVar40->tfar;
                    auVar95._4_4_ = pRVar40->mask;
                    auVar95._8_4_ = pRVar40->id;
                    auVar95._12_4_ = pRVar40->flags;
                    uVar46 = vextractps_avx(auVar95,1);
                    ray = (RayHit *)local_2650._0_8_;
                  }
                  local_2620 = auVar95;
                  if ((((local_2640 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2640 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2640 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2640[0xf]) break;
                  local_2650._0_8_ = ray;
                  BVHNIntersector1<8,1,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Moeller<4,true>>>
                  ::intersect(&local_2610);
                  piVar49 = local_2610.valid;
                  ray = (RayHit *)local_2650._0_8_;
                  auVar95 = local_2620;
                } while( true );
              }
            }
            lVar53 = local_25e0._0_8_ + 1;
          } while (lVar53 != local_25b8);
        }
        fVar57 = (ray->super_RayK<1>).tfar;
        auVar64 = ZEXT3264(CONCAT428(fVar57,CONCAT424(fVar57,CONCAT420(fVar57,CONCAT416(fVar57,
                                                  CONCAT412(fVar57,CONCAT48(fVar57,CONCAT44(fVar57,
                                                  fVar57))))))));
        auVar94 = ZEXT3264(local_23c0);
        auVar97 = ZEXT3264(local_23e0);
        auVar100 = ZEXT3264(local_2400);
        auVar105 = ZEXT3264(local_2420);
        auVar109 = ZEXT3264(local_2440);
        auVar110 = ZEXT3264(local_2460);
        auVar111 = ZEXT3264(local_2480);
      }
    } while (pauVar42 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }